

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linit.c
# Opt level: O0

void luaL_openlibs(lua_State *L)

{
  luaL_Reg *local_18;
  luaL_Reg *lib;
  lua_State *L_local;
  
  for (local_18 = loadedlibs; local_18->func != (lua_CFunction)0x0; local_18 = local_18 + 1) {
    luaL_requiref(L,local_18->name,local_18->func,1);
    lua_settop(L,-2);
  }
  return;
}

Assistant:

LUALIB_API void luaL_openlibs (lua_State *L) {
  const luaL_Reg *lib;
  /* "require" functions from 'loadedlibs' and set results to global table */
  for (lib = loadedlibs; lib->func; lib++) {
    luaL_requiref(L, lib->name, lib->func, 1);
    lua_pop(L, 1);  /* remove lib */
  }
}